

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::Server(Server *this,string *alias)

{
  string *alias_local;
  Server *this_local;
  
  std::__cxx11::string::string((string *)this);
  this->terminate_server = false;
  this->send_to_client = false;
  this->rcv_from_client = false;
  this->server_rcv = false;
  memcpy(this->buffer,"",0x100);
  Message::Message(&this->msg_for_client);
  Message::Message(&this->msg_from_client);
  std::__cxx11::string::operator=((string *)this,(string *)alias);
  return;
}

Assistant:

Server::Server(std::string alias)
{
    name = alias;
}